

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmTarget *pcVar1;
  Snapshot snapshot;
  char *pcVar2;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator local_1a1;
  undefined1 local_1a0 [8];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  cmState *local_178;
  string local_170;
  cmGeneratorExpression local_150;
  cmGeneratorExpressionDAGChecker local_110;
  Snapshot local_48;
  
  std::__cxx11::string::string((string *)&local_110,"AUTOUIC_OPTIONS",(allocator *)&local_150);
  pcVar2 = GetLinkInterfaceDependentStringProperty(this,(string *)&local_110,config);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 != (char *)0x0) {
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
    local_198._0_8_ = &local_188;
    local_198._8_8_ = 0;
    local_188._M_local_buf[0] = '\0';
    local_178 = (cmState *)0x0;
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&local_110,snapshot,(cmCommandContext *)local_198);
    cmGeneratorExpression::cmGeneratorExpression(&local_150,(cmListFileBacktrace *)&local_110);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_110);
    std::__cxx11::string::~string((string *)local_198);
    pcVar1 = this->Target;
    std::__cxx11::string::string((string *)local_198,"AUTOUIC_OPTIONS",(allocator *)&local_170);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_110,&pcVar1->Name,(string *)local_198,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)local_198);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1a0,(char *)&local_150);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_1a0,this->LocalGenerator,config,false
                        ,this,&local_110,&local_170);
    std::__cxx11::string::string((string *)local_198,pcVar2,&local_1a1);
    cmSystemTools::ExpandListArgument((string *)local_198,result,false);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_170);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_1a0);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_110);
    cmGeneratorExpression::~cmGeneratorExpression(&local_150);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string> &result,
                                 const std::string& config) const
{
  const char *prop
            = this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS",
                                                            config);
  if (!prop)
    {
    return;
    }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      this->GetName(),
                                      "AUTOUIC_OPTIONS", 0, 0);
  cmSystemTools::ExpandListArgument(ge.Parse(prop)
                                      ->Evaluate(this->LocalGenerator,
                                                config,
                                                false,
                                                this,
                                                &dagChecker),
                                  result);
}